

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_rtext.c
# Opt level: O0

void rtext_free(_rtext *x)

{
  _rtext *local_18;
  _rtext *e2;
  _rtext *x_local;
  
  if (x->x_glist->gl_editor->e_textedfor == x) {
    x->x_glist->gl_editor->e_textedfor = (_rtext *)0x0;
  }
  if (x->x_glist->gl_editor->e_rtext == x) {
    x->x_glist->gl_editor->e_rtext = x->x_next;
  }
  else {
    for (local_18 = x->x_glist->gl_editor->e_rtext; local_18 != (_rtext *)0x0;
        local_18 = local_18->x_next) {
      if (local_18->x_next == x) {
        local_18->x_next = x->x_next;
        break;
      }
    }
  }
  freebytes(x->x_buf,(long)(x->x_bufsize + 1));
  freebytes(x,0x78);
  return;
}

Assistant:

void rtext_free(t_rtext *x)
{
    if (x->x_glist->gl_editor->e_textedfor == x)
        x->x_glist->gl_editor->e_textedfor = 0;
    if (x->x_glist->gl_editor->e_rtext == x)
        x->x_glist->gl_editor->e_rtext = x->x_next;
    else
    {
        t_rtext *e2;
        for (e2 = x->x_glist->gl_editor->e_rtext; e2; e2 = e2->x_next)
            if (e2->x_next == x)
        {
            e2->x_next = x->x_next;
            break;
        }
    }
    freebytes(x->x_buf, x->x_bufsize + 1); /* extra 0 byte */
    freebytes(x, sizeof *x);
}